

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
          *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *in_RSI;
  long *in_RDI;
  bool dummy [6];
  bool same;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *typed_other;
  GTestLog *in_stack_ffffffffffffff10;
  undefined1 *puVar5;
  bool local_e1;
  ParamIterator<(anonymous_namespace)::TestVideoParam> *in_stack_ffffffffffffff28;
  ParamIterator<int> *other_00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar6;
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
  *in_stack_ffffffffffffff40;
  bool local_b1;
  bool local_99;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  GTestLogSeverity in_stack_ffffffffffffff8c;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
  *in_stack_ffffffffffffff90;
  undefined1 local_3c;
  undefined1 local_3b [31];
  GTestLog local_1c;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  lVar2 = (**(code **)(*in_RDI + 0x10))();
  lVar3 = (**(code **)(*local_18 + 0x10))();
  bVar1 = IsTrue(lVar2 == lVar3);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    poVar4 = GTestLog::GetStream(&local_1c);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    in_stack_ffffffffffffff90 =
         (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *)
         std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffff10);
  }
  local_3b._3_8_ =
       CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,int,unsigned_int,int,int>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>const,testing::internal::ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,int,unsigned_int,int,int>>const>
                 (in_stack_ffffffffffffff40);
  bVar1 = AtEnd(in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = AtEnd(in_stack_ffffffffffffff90), bVar1)) {
    local_1 = true;
  }
  else {
    local_3b[2] = 1;
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x870081);
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x870097);
    local_3b[2] = ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                            ((ParamIterator<const_libaom_test::CodecFactory_*> *)
                             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                             (ParamIterator<const_libaom_test::CodecFactory_*> *)
                             in_stack_ffffffffffffff28);
    bVar1 = false;
    if ((bool)local_3b[2]) {
      std::
      get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x8700f9);
      std::
      get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x87010f);
      bVar1 = ParamIterator<(anonymous_namespace)::TestVideoParam>::operator==
                        ((ParamIterator<(anonymous_namespace)::TestVideoParam> *)
                         CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28);
    }
    local_3b[2] = bVar1;
    local_99 = false;
    if ((bool)local_3b[2] != false) {
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x87016c);
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x870182);
      local_99 = ParamIterator<int>::operator==
                           ((ParamIterator<int> *)
                            CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                            (ParamIterator<int> *)in_stack_ffffffffffffff28);
    }
    local_3b[2] = local_99;
    puVar5 = &local_3c;
    local_b1 = false;
    if (local_99 != false) {
      std::
      get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x8701df);
      std::
      get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x8701f5);
      local_b1 = ParamIterator<unsigned_int>::operator==
                           ((ParamIterator<unsigned_int> *)
                            CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                            (ParamIterator<unsigned_int> *)in_stack_ffffffffffffff28);
    }
    local_3b[2] = local_b1;
    *puVar5 = local_b1;
    other_00 = (ParamIterator<int> *)local_3b;
    uVar6 = false;
    if ((local_3b[2] & 1) != 0) {
      std::
      get<4ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x870252);
      std::
      get<4ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x870268);
      uVar6 = ParamIterator<int>::operator==
                        ((ParamIterator<int> *)CONCAT17(uVar6,in_stack_ffffffffffffff30),other_00);
    }
    local_3b[2] = uVar6;
    *(undefined1 *)
     &(other_00->impl_)._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
         uVar6;
    puVar5 = local_3b + 1;
    local_e1 = false;
    if ((local_3b[2] & 1) != 0) {
      std::
      get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x8702c5);
      std::
      get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                  *)0x8702da);
      local_e1 = ParamIterator<int>::operator==
                           ((ParamIterator<int> *)CONCAT17(uVar6,in_stack_ffffffffffffff30),other_00
                           );
    }
    local_3b[2] = local_e1;
    *puVar5 = local_e1;
    local_1 = (bool)(local_3b[2] & 1);
  }
  return local_1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }